

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O0

err_t btokCVCIss(octet *cert,size_t *cert_len,btok_cvc_t *cvc,octet *certa,size_t certa_len,
                octet *privkeya,size_t privkeya_len)

{
  blob_t pvVar1;
  btok_cvc_t *in_R9;
  btok_cvc_t *cvca;
  size_t in_stack_00000008;
  err_t code;
  octet *in_stack_00000040;
  btok_cvc_t *in_stack_00000048;
  size_t in_stack_00000120;
  octet *in_stack_00000128;
  size_t in_stack_00000130;
  octet *in_stack_00000138;
  size_t in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  pvVar1 = blobCreate(in_stack_ffffffffffffffb8);
  if (pvVar1 == (blob_t)0x0) {
    local_4 = 0x6e;
  }
  else {
    local_4 = btokCVCUnwrap(in_stack_00000048,in_stack_00000040,(size_t)cert,(octet *)cert_len,
                            (size_t)cvc);
    if (local_4 == 0) {
      local_4 = btokCVCCheck2(in_R9,(btok_cvc_t *)(ulong)in_stack_ffffffffffffffc0);
      if (local_4 == 0) {
        local_4 = btokKeypairVal(in_stack_00000138,in_stack_00000130,in_stack_00000128,
                                 in_stack_00000120);
        if (local_4 == 0) {
          local_4 = btokCVCWrap((octet *)cvc,(size_t *)certa,(btok_cvc_t *)certa_len,privkeya,
                                in_stack_00000008);
          blobClose((blob_t)0x1530ec);
        }
        else {
          blobClose((blob_t)0x1530b7);
        }
      }
      else {
        blobClose((blob_t)0x153077);
      }
    }
    else {
      blobClose((blob_t)0x153048);
    }
  }
  return local_4;
}

Assistant:

err_t btokCVCIss(octet cert[], size_t* cert_len, btok_cvc_t* cvc,
	const octet certa[], size_t certa_len, const octet privkeya[],
	size_t privkeya_len)
{
	err_t code;
	btok_cvc_t* cvca;
	// разобрать сертификат издателя
	cvca = (btok_cvc_t*)blobCreate(sizeof(btok_cvc_t));
	if (!cvca)
		return ERR_OUTOFMEMORY;
	code = btokCVCUnwrap(cvca, certa, certa_len, 0, 0);
	ERR_CALL_HANDLE(code, blobClose(cvca));
	// проверить содержимое выпускаемого сертификата
	code = btokCVCCheck2(cvc, cvca);
	ERR_CALL_HANDLE(code, blobClose(cvca));
	// проверить ключи издателя
	code = btokKeypairVal(privkeya, privkeya_len, cvca->pubkey,
		cvca->pubkey_len);
	ERR_CALL_HANDLE(code, blobClose(cvca));
	// создать сертификат
	code = btokCVCWrap(cert, cert_len, cvc, privkeya, privkeya_len);
	// завершить
	blobClose(cvca);
	return code;
}